

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::GetRotationMatrix
          (FBXConverter *this,RotOrder mode,aiVector3D *rotation,aiMatrix4x4 *out)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined1 auVar37 [12];
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined1 (*pauVar43) [12];
  long lVar44;
  bool *pbVar45;
  undefined1 (*pauVar46) [12];
  bool *pbVar47;
  bool *pbVar48;
  undefined1 (*pauVar49) [12];
  float fVar50;
  aiMatrix4x4 temp [3];
  bool local_fb [3];
  undefined1 local_f8 [8];
  float fStack_f0;
  undefined4 local_e8;
  undefined8 auStack_e4 [2];
  float fStack_d4;
  undefined1 auStack_d0 [8];
  undefined8 uStack_c8;
  float fStack_c0;
  undefined8 auStack_bc [2];
  undefined4 uStack_ac;
  float local_a8 [8];
  undefined8 uStack_88;
  float local_80;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined4 uStack_40;
  undefined8 uStack_3c;
  undefined8 uStack_34;
  undefined4 local_2c;
  
  if (mode == RotOrder_SphericXYZ) {
    LogFunctions<Assimp::FBXImporter>::LogError((char *)0x16ffd3);
    out->a1 = 1.0;
    out->a2 = 0.0;
    out->a3 = 0.0;
    out->a4 = 0.0;
    out->b1 = 0.0;
    out->b2 = 1.0;
    out->b3 = 0.0;
    out->b4 = 0.0;
    out->c1 = 0.0;
    out->c2 = 0.0;
    out->c3 = 1.0;
    out->c4 = 0.0;
    out->d1 = 0.0;
    out->d2 = 0.0;
    out->d3 = 0.0;
    out->d4 = 1.0;
    return;
  }
  pauVar46 = (undefined1 (*) [12])&local_68;
  out->a1 = 1.0;
  out->a2 = 0.0;
  out->a3 = 0.0;
  out->a4 = 0.0;
  out->b1 = 0.0;
  out->b2 = 1.0;
  out->b3 = 0.0;
  out->b4 = 0.0;
  out->c1 = 0.0;
  out->c2 = 0.0;
  out->c3 = 1.0;
  out->c4 = 0.0;
  out->d1 = 0.0;
  out->d2 = 0.0;
  out->d3 = 0.0;
  out->d4 = 1.0;
  local_fb[2] = true;
  local_fb[1] = true;
  local_fb[0] = true;
  lVar44 = 0;
  do {
    *(undefined4 *)((long)&local_e8 + lVar44) = 0x3f800000;
    *(undefined8 *)((long)auStack_e4 + lVar44) = 0;
    *(undefined8 *)((long)auStack_e4 + lVar44 + 8) = 0;
    *(undefined4 *)((long)&fStack_d4 + lVar44) = 0x3f800000;
    *(undefined8 *)(auStack_d0 + lVar44) = 0;
    *(undefined8 *)((long)&uStack_c8 + lVar44) = 0;
    *(undefined4 *)((long)&fStack_c0 + lVar44) = 0x3f800000;
    *(undefined8 *)((long)auStack_bc + lVar44) = 0;
    *(undefined8 *)((long)auStack_bc + lVar44 + 8) = 0;
    *(undefined4 *)((long)&uStack_ac + lVar44) = 0x3f800000;
    lVar44 = lVar44 + 0x40;
  } while (lVar44 != 0xc0);
  bVar3 = 1.1920929e-07 < ABS(rotation->z);
  if (bVar3) {
    fVar50 = rotation->z * 0.017453292;
    _local_f8 = ZEXT416((uint)fVar50);
    uStack_60 = 0;
    uStack_50 = 0;
    uStack_48 = 0;
    uStack_40 = 0x3f800000;
    uStack_3c = 0;
    uStack_34 = 0;
    local_2c = 0x3f800000;
    local_68 = cosf(fVar50);
    fStack_54 = local_68;
    local_58 = sinf((float)local_f8._0_4_);
    fStack_64 = -local_58;
    local_fb[0] = false;
  }
  local_fb[0] = !bVar3;
  if (1.1920929e-07 < ABS(rotation->y)) {
    fVar50 = rotation->y * 0.017453292;
    _local_f8 = ZEXT416((uint)fVar50);
    local_a8[1] = 0.0;
    local_a8[2] = 0.0;
    local_a8[3] = 0.0;
    local_a8[4] = 0.0;
    local_a8[5] = 1.0;
    local_a8[6] = 0.0;
    local_a8[7] = 0.0;
    uStack_88 = 0;
    local_7c = 0;
    uStack_74 = 0;
    local_6c = 0x3f800000;
    local_a8[0] = cosf(fVar50);
    local_80 = local_a8[0];
    fVar50 = sinf((float)local_f8._0_4_);
    local_a8[2] = fVar50;
    uStack_88 = CONCAT44(uStack_88._4_4_,fVar50) ^ 0x80000000;
    local_fb[1] = false;
  }
  if (1.1920929e-07 < ABS(rotation->x)) {
    fVar50 = rotation->x * 0.017453292;
    _local_f8 = ZEXT416((uint)fVar50);
    local_e8 = 0x3f800000;
    auStack_e4[0] = 0;
    auStack_e4[1] = 0;
    stack0xffffffffffffff34 = 0;
    auStack_bc[0] = 0;
    auStack_bc[1] = 0;
    uStack_ac = 0x3f800000;
    fStack_d4 = cosf(fVar50);
    fStack_c0 = fStack_d4;
    uStack_c8._4_4_ = sinf((float)local_f8._0_4_);
    auStack_d0._0_4_ = -uStack_c8._4_4_;
    local_fb[2] = false;
  }
  pauVar43 = pauVar46;
  pauVar49 = pauVar46;
  switch(mode) {
  case RotOrder_EulerXYZ:
    pbVar47 = local_fb;
    pbVar45 = local_fb + 2;
    pauVar43 = (undefined1 (*) [12])&local_e8;
    break;
  case RotOrder_EulerXZY:
    pbVar48 = local_fb;
    pbVar45 = local_fb + 2;
    pauVar43 = (undefined1 (*) [12])&local_e8;
    goto LAB_00170288;
  case RotOrder_EulerYZX:
    pbVar47 = local_fb + 2;
    pauVar49 = (undefined1 (*) [12])&local_e8;
    pbVar48 = local_fb;
    goto LAB_00170267;
  case RotOrder_EulerYXZ:
    pbVar47 = local_fb;
    pbVar48 = local_fb + 2;
    pauVar46 = (undefined1 (*) [12])&local_e8;
LAB_00170267:
    pbVar45 = local_fb + 1;
    pauVar43 = (undefined1 (*) [12])local_a8;
    goto LAB_001702a7;
  case RotOrder_EulerZXY:
    pbVar48 = local_fb + 2;
    pbVar45 = local_fb;
    pauVar46 = (undefined1 (*) [12])&local_e8;
LAB_00170288:
    pbVar47 = local_fb + 1;
    pauVar49 = (undefined1 (*) [12])local_a8;
    goto LAB_001702a7;
  case RotOrder_EulerZYX:
    pbVar47 = local_fb + 2;
    pbVar45 = local_fb;
    pauVar49 = (undefined1 (*) [12])&local_e8;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0x26b,
                  "void Assimp::FBX::FBXConverter::GetRotationMatrix(Model::RotOrder, const aiVector3D &, aiMatrix4x4 &)"
                 );
  }
  pbVar48 = local_fb + 1;
  pauVar46 = (undefined1 (*) [12])local_a8;
LAB_001702a7:
  if (*pbVar47 == false) {
    uVar41 = *(undefined4 *)((long)pauVar49 + 0);
    uVar42 = *(undefined4 *)((long)pauVar49 + 4);
    uVar32 = *(undefined8 *)(*pauVar49 + 8);
    uVar33 = *(undefined8 *)(pauVar49[1] + 4);
    uVar39 = *(undefined4 *)((long)(pauVar49 + 2) + 0);
    uVar40 = *(undefined4 *)((long)(pauVar49 + 2) + 4);
    uVar34 = *(undefined8 *)(pauVar49[2] + 8);
    uVar35 = *(undefined8 *)(pauVar49[3] + 4);
    uVar38 = *(undefined4 *)((long)(pauVar49 + 4) + 4);
    uVar36 = *(undefined8 *)(pauVar49[4] + 8);
    out->d1 = (float)*(undefined4 *)((long)(pauVar49 + 4) + 0);
    out->d2 = (float)uVar38;
    out->d3 = (float)(int)uVar36;
    out->d4 = (float)(int)((ulong)uVar36 >> 0x20);
    out->c1 = (float)(int)uVar34;
    out->c2 = (float)(int)((ulong)uVar34 >> 0x20);
    out->c3 = (float)(int)uVar35;
    out->c4 = (float)(int)((ulong)uVar35 >> 0x20);
    out->b1 = (float)(int)uVar33;
    out->b2 = (float)(int)((ulong)uVar33 >> 0x20);
    out->b3 = (float)uVar39;
    out->b4 = (float)uVar40;
    out->a1 = (float)uVar41;
    out->a2 = (float)uVar42;
    out->a3 = (float)(int)uVar32;
    out->a4 = (float)(int)((ulong)uVar32 >> 0x20);
  }
  if (*pbVar48 == false) {
    fVar4 = out->a1;
    fVar5 = out->a2;
    fVar6 = out->a3;
    fVar7 = out->a4;
    fVar8 = out->b1;
    fVar9 = out->b2;
    fVar10 = out->b3;
    fVar11 = out->b4;
    fVar12 = out->c1;
    fVar13 = out->c2;
    fVar14 = out->c3;
    fVar15 = out->c4;
    fVar16 = out->d1;
    fVar17 = *(float *)(*pauVar46 + 4);
    fVar18 = *(float *)(*pauVar46 + 8);
    auVar37 = *pauVar46;
    fVar19 = *(float *)pauVar46[1];
    fVar20 = *(float *)(pauVar46[1] + 4);
    fVar21 = *(float *)(pauVar46[1] + 8);
    fVar22 = *(float *)pauVar46[2];
    fVar23 = *(float *)(pauVar46[2] + 4);
    fVar24 = *(float *)(pauVar46[2] + 8);
    fVar25 = *(float *)pauVar46[3];
    fVar26 = *(float *)(pauVar46[3] + 4);
    fVar27 = *(float *)(pauVar46[3] + 8);
    fVar28 = *(float *)pauVar46[4];
    fVar29 = *(float *)(pauVar46[4] + 4);
    fVar30 = *(float *)(pauVar46[4] + 8);
    fVar31 = *(float *)pauVar46[5];
    fVar50 = out->d2;
    fVar1 = out->d3;
    fVar2 = out->d4;
    out->a1 = fVar7 * fVar28 + fVar6 * fVar24 + fVar4 * *(float *)*pauVar46 + fVar5 * fVar20;
    out->a2 = fVar7 * fVar29 + fVar6 * fVar25 + fVar4 * fVar17 + fVar5 * fVar21;
    out->a3 = fVar7 * fVar30 + fVar6 * fVar26 + fVar4 * fVar18 + fVar5 * fVar22;
    out->a4 = fVar7 * fVar31 + fVar6 * fVar27 + fVar4 * fVar19 + fVar5 * fVar23;
    local_f8._0_4_ = auVar37._0_4_;
    local_f8._4_4_ = auVar37._4_4_;
    fStack_f0 = auVar37._8_4_;
    out->b1 = fVar11 * fVar28 + fVar10 * fVar24 + fVar8 * (float)local_f8._0_4_ + fVar9 * fVar20;
    out->b2 = fVar11 * fVar29 + fVar10 * fVar25 + fVar8 * (float)local_f8._4_4_ + fVar9 * fVar21;
    out->b3 = fVar11 * fVar30 + fVar10 * fVar26 + fVar8 * fStack_f0 + fVar9 * fVar22;
    out->b4 = fVar11 * fVar31 + fVar10 * fVar27 + fVar8 * fVar19 + fVar9 * fVar23;
    out->c1 = fVar15 * fVar28 + fVar14 * fVar24 + fVar12 * (float)local_f8._0_4_ + fVar13 * fVar20;
    out->c2 = fVar15 * fVar29 + fVar14 * fVar25 + fVar12 * (float)local_f8._4_4_ + fVar13 * fVar21;
    out->c3 = fVar15 * fVar30 + fVar14 * fVar26 + fVar12 * fStack_f0 + fVar13 * fVar22;
    out->c4 = fVar15 * fVar31 + fVar14 * fVar27 + fVar12 * fVar19 + fVar13 * fVar23;
    out->d1 = fVar2 * fVar28 + fVar1 * fVar24 + fVar16 * (float)local_f8._0_4_ + fVar50 * fVar20;
    out->d2 = fVar2 * fVar29 + fVar1 * fVar25 + fVar16 * (float)local_f8._4_4_ + fVar50 * fVar21;
    out->d3 = fVar2 * fVar30 + fVar1 * fVar26 + fVar16 * fStack_f0 + fVar50 * fVar22;
    out->d4 = fVar2 * fVar31 + fVar1 * fVar27 + fVar16 * fVar19 + fVar50 * fVar23;
  }
  if (*pbVar45 == false) {
    fVar4 = out->a1;
    fVar5 = out->a2;
    fVar6 = out->a3;
    fVar7 = out->a4;
    fVar8 = out->b1;
    fVar9 = out->b2;
    fVar10 = out->b3;
    fVar11 = out->b4;
    fVar12 = out->c1;
    fVar13 = out->c2;
    fVar14 = out->c3;
    fVar15 = out->c4;
    fVar16 = out->d1;
    fVar17 = *(float *)(*pauVar43 + 4);
    fVar18 = *(float *)(*pauVar43 + 8);
    auVar37 = *pauVar43;
    fVar19 = *(float *)pauVar43[1];
    fVar20 = *(float *)(pauVar43[1] + 4);
    fVar21 = *(float *)(pauVar43[1] + 8);
    fVar22 = *(float *)pauVar43[2];
    fVar23 = *(float *)(pauVar43[2] + 4);
    fVar24 = *(float *)(pauVar43[2] + 8);
    fVar25 = *(float *)pauVar43[3];
    fVar26 = *(float *)(pauVar43[3] + 4);
    fVar27 = *(float *)(pauVar43[3] + 8);
    fVar28 = *(float *)pauVar43[4];
    fVar29 = *(float *)(pauVar43[4] + 4);
    fVar30 = *(float *)(pauVar43[4] + 8);
    fVar31 = *(float *)pauVar43[5];
    fVar50 = out->d2;
    fVar1 = out->d3;
    fVar2 = out->d4;
    out->a1 = fVar7 * fVar28 + fVar6 * fVar24 + fVar4 * *(float *)*pauVar43 + fVar5 * fVar20;
    out->a2 = fVar7 * fVar29 + fVar6 * fVar25 + fVar4 * fVar17 + fVar5 * fVar21;
    out->a3 = fVar7 * fVar30 + fVar6 * fVar26 + fVar4 * fVar18 + fVar5 * fVar22;
    out->a4 = fVar7 * fVar31 + fVar6 * fVar27 + fVar4 * fVar19 + fVar5 * fVar23;
    local_f8._0_4_ = auVar37._0_4_;
    local_f8._4_4_ = auVar37._4_4_;
    fStack_f0 = auVar37._8_4_;
    out->b1 = fVar11 * fVar28 + fVar10 * fVar24 + fVar8 * (float)local_f8._0_4_ + fVar9 * fVar20;
    out->b2 = fVar11 * fVar29 + fVar10 * fVar25 + fVar8 * (float)local_f8._4_4_ + fVar9 * fVar21;
    out->b3 = fVar11 * fVar30 + fVar10 * fVar26 + fVar8 * fStack_f0 + fVar9 * fVar22;
    out->b4 = fVar11 * fVar31 + fVar10 * fVar27 + fVar8 * fVar19 + fVar9 * fVar23;
    out->c1 = fVar15 * fVar28 + fVar14 * fVar24 + fVar12 * (float)local_f8._0_4_ + fVar13 * fVar20;
    out->c2 = fVar15 * fVar29 + fVar14 * fVar25 + fVar12 * (float)local_f8._4_4_ + fVar13 * fVar21;
    out->c3 = fVar15 * fVar30 + fVar14 * fVar26 + fVar12 * fStack_f0 + fVar13 * fVar22;
    out->c4 = fVar15 * fVar31 + fVar14 * fVar27 + fVar12 * fVar19 + fVar13 * fVar23;
    out->d1 = fVar2 * fVar28 + fVar1 * fVar24 + fVar16 * (float)local_f8._0_4_ + fVar50 * fVar20;
    out->d2 = fVar2 * fVar29 + fVar1 * fVar25 + fVar16 * (float)local_f8._4_4_ + fVar50 * fVar21;
    out->d3 = fVar2 * fVar30 + fVar1 * fVar26 + fVar16 * fStack_f0 + fVar50 * fVar22;
    out->d4 = fVar2 * fVar31 + fVar1 * fVar27 + fVar16 * fVar19 + fVar50 * fVar23;
  }
  return;
}

Assistant:

void FBXConverter::GetRotationMatrix(Model::RotOrder mode, const aiVector3D& rotation, aiMatrix4x4& out)
        {
            if (mode == Model::RotOrder_SphericXYZ) {
                FBXImporter::LogError("Unsupported RotationMode: SphericXYZ");
                out = aiMatrix4x4();
                return;
            }

            const float angle_epsilon = Math::getEpsilon<float>();

            out = aiMatrix4x4();

            bool is_id[3] = { true, true, true };

            aiMatrix4x4 temp[3];
            if (std::fabs(rotation.z) > angle_epsilon) {
                aiMatrix4x4::RotationZ(AI_DEG_TO_RAD(rotation.z), temp[2]);
                is_id[2] = false;
            }
            if (std::fabs(rotation.y) > angle_epsilon) {
                aiMatrix4x4::RotationY(AI_DEG_TO_RAD(rotation.y), temp[1]);
                is_id[1] = false;
            }
            if (std::fabs(rotation.x) > angle_epsilon) {
                aiMatrix4x4::RotationX(AI_DEG_TO_RAD(rotation.x), temp[0]);
                is_id[0] = false;
            }

            int order[3] = { -1, -1, -1 };

            // note: rotation order is inverted since we're left multiplying as is usual in assimp
            switch (mode)
            {
            case Model::RotOrder_EulerXYZ:
                order[0] = 2;
                order[1] = 1;
                order[2] = 0;
                break;

            case Model::RotOrder_EulerXZY:
                order[0] = 1;
                order[1] = 2;
                order[2] = 0;
                break;

            case Model::RotOrder_EulerYZX:
                order[0] = 0;
                order[1] = 2;
                order[2] = 1;
                break;

            case Model::RotOrder_EulerYXZ:
                order[0] = 2;
                order[1] = 0;
                order[2] = 1;
                break;

            case Model::RotOrder_EulerZXY:
                order[0] = 1;
                order[1] = 0;
                order[2] = 2;
                break;

            case Model::RotOrder_EulerZYX:
                order[0] = 0;
                order[1] = 1;
                order[2] = 2;
                break;

            default:
                ai_assert(false);
                break;
            }

            ai_assert(order[0] >= 0);
            ai_assert(order[0] <= 2);
            ai_assert(order[1] >= 0);
            ai_assert(order[1] <= 2);
            ai_assert(order[2] >= 0);
            ai_assert(order[2] <= 2);

            if (!is_id[order[0]]) {
                out = temp[order[0]];
            }

            if (!is_id[order[1]]) {
                out = out * temp[order[1]];
            }

            if (!is_id[order[2]]) {
                out = out * temp[order[2]];
            }
        }